

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::MemObjectAllocator::MemObjectAllocator
          (MemObjectAllocator *this,TestLog *log,RenderContext *renderContext,
          MemObjectType objectTypes,MemObjectConfig *config,int seed)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_seed = seed;
  this->m_objectCount = 0;
  this->m_bytesRequired = 0;
  this->m_objectTypes = objectTypes;
  this->m_result = RESULT_LAST;
  iVar1 = config->maxBufferSize;
  iVar6 = config->minTextureSize;
  iVar2 = config->maxTextureSize;
  (this->m_config).minBufferSize = config->minBufferSize;
  (this->m_config).maxBufferSize = iVar1;
  (this->m_config).minTextureSize = iVar6;
  (this->m_config).maxTextureSize = iVar2;
  bVar3 = config->write;
  bVar4 = config->use;
  uVar5 = config->field_0x13;
  (this->m_config).useDummyData = config->useDummyData;
  (this->m_config).write = bVar3;
  (this->m_config).use = bVar4;
  (this->m_config).field_0x13 = uVar5;
  this->m_glError = 0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dummyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BufferRenderer::BufferRenderer(&this->m_bufferRenderer,log,renderContext);
  TextureRenderer::TextureRenderer(&this->m_textureRenderer,log,renderContext);
  if ((this->m_config).useDummyData == true) {
    iVar1 = (this->m_config).maxBufferSize;
    iVar6 = (this->m_config).maxTextureSize;
    iVar6 = iVar6 * iVar6 * 4;
    if (iVar6 < iVar1) {
      iVar6 = iVar1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(long)iVar6,
               &local_49);
  }
  else {
    if ((this->m_config).write != true) {
      return;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0x80,&local_49);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->m_dummyData,&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

MemObjectAllocator::MemObjectAllocator (tcu::TestLog& log, glu::RenderContext& renderContext, MemObjectType objectTypes, const MemObjectConfig& config, int seed)
	: m_seed			(seed)
	, m_objectCount		(0)
	, m_bytesRequired	(0)
	, m_objectTypes		(objectTypes)
	, m_result			(RESULT_LAST)
	, m_config			(config)
	, m_glError			(0)
	, m_bufferRenderer	(log, renderContext)
	, m_textureRenderer	(log, renderContext)
{
	DE_UNREF(renderContext);

	if (m_config.useDummyData)
	{
		int dummySize = deMax32(m_config.maxBufferSize, m_config.maxTextureSize*m_config.maxTextureSize*4);
		m_dummyData = vector<deUint8>(dummySize);
	}
	else if (m_config.write)
		m_dummyData = vector<deUint8>(128);
}